

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

void __thiscall duckdb::BaseQueryResult::~BaseQueryResult(BaseQueryResult *this)

{
  ~BaseQueryResult(this);
  operator_delete(this);
  return;
}

Assistant:

BaseQueryResult::~BaseQueryResult() {
}